

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Field.cpp
# Opt level: O1

void __thiscall
OpenMD::Field<OpenMD::Vector3<double>_>::postProcess(Field<OpenMD::Vector3<double>_> *this)

{
  double dVar1;
  pointer pvVar2;
  pointer pvVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  uint i;
  long lVar11;
  long lVar12;
  ulong uVar13;
  
  pvVar2 = (this->field_).
           super__Vector_base<std::vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>,_std::allocator<std::vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar4 = (long)(this->field_).
                super__Vector_base<std::vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>,_std::allocator<std::vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar2;
  if (lVar4 != 0) {
    uVar5 = (lVar4 >> 3) * -0x5555555555555555;
    uVar6 = 0;
    do {
      lVar4 = *(long *)&pvVar2[uVar6].
                        super__Vector_base<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>
                        ._M_impl.super__Vector_impl_data;
      lVar7 = (long)*(pointer *)
                     ((long)&pvVar2[uVar6].
                             super__Vector_base<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>
                             ._M_impl.super__Vector_impl_data + 8) - lVar4;
      if (lVar7 != 0) {
        uVar8 = (lVar7 >> 3) * -0x5555555555555555;
        pvVar3 = (this->dens_).
                 super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar9 = 0;
        do {
          lVar7 = *(long *)(lVar4 + uVar9 * 0x18);
          lVar12 = *(long *)(lVar4 + 8 + uVar9 * 0x18) - lVar7;
          if (lVar12 != 0) {
            uVar13 = (lVar12 >> 3) * -0x5555555555555555;
            lVar12 = *(long *)(*(long *)&pvVar3[uVar6].
                                         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                         ._M_impl.super__Vector_impl_data + uVar9 * 0x18);
            uVar10 = 0;
            do {
              dVar1 = *(double *)(lVar12 + uVar10 * 8);
              if (0.0 < dVar1) {
                lVar11 = 0;
                do {
                  *(double *)(lVar7 + lVar11 * 8) = *(double *)(lVar7 + lVar11 * 8) / dVar1;
                  lVar11 = lVar11 + 1;
                } while (lVar11 != 3);
              }
              uVar10 = uVar10 + 1;
              lVar7 = lVar7 + 0x18;
            } while ((uVar10 & 0xffffffff) <= uVar13 && uVar13 - (uVar10 & 0xffffffff) != 0);
          }
          uVar9 = uVar9 + 1;
        } while ((uVar9 & 0xffffffff) <= uVar8 && uVar8 - (uVar9 & 0xffffffff) != 0);
      }
      uVar6 = uVar6 + 1;
    } while ((uVar6 & 0xffffffff) <= uVar5 && uVar5 - (uVar6 & 0xffffffff) != 0);
  }
  return;
}

Assistant:

void Field<T>::postProcess() {
    for (unsigned int i = 0; i < field_.size(); ++i) {
      for (unsigned int j = 0; j < field_[i].size(); ++j) {
        for (unsigned int k = 0; k < field_[i][j].size(); ++k) {
          if (dens_[i][j][k] > 0.0) { field_[i][j][k] /= dens_[i][j][k]; }
        }
      }
    }
  }